

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy_dp.c
# Opt level: O2

DP_WSR_Stream
DummyInitWriterPerReader
          (CP_Services Svcs,DP_WS_Stream WS_Stream_v,int readerCohortSize,CP_PeerCohort PeerCohort,
          void **providedReaderInfo_v,void **WriterContactInfoPtr)

{
  int iVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  SMPI_Comm comm;
  char *__s;
  void *pvVar5;
  char *pcVar6;
  undefined8 *puVar7;
  ulong uVar8;
  int Rank;
  
  puVar4 = (undefined8 *)malloc(0x20);
  comm = (*Svcs->getMPIComm)(*(void **)((long)WS_Stream_v + 8));
  __s = (char *)malloc(0x40);
  SMPI_Comm_rank(comm,&Rank);
  snprintf(__s,0x40,"Writer Rank %d, test contact",(ulong)(uint)Rank);
  *puVar4 = WS_Stream_v;
  puVar4[1] = PeerCohort;
  pvVar5 = malloc((long)readerCohortSize << 4);
  puVar4[3] = pvVar5;
  if (readerCohortSize < 1) {
    readerCohortSize = 0;
  }
  puVar7 = (undefined8 *)((long)pvVar5 + 8);
  for (uVar8 = 0; (uint)readerCohortSize != uVar8; uVar8 = uVar8 + 1) {
    puVar2 = (undefined8 *)providedReaderInfo_v[uVar8];
    pcVar6 = strdup((char *)*puVar2);
    puVar7[-1] = pcVar6;
    uVar3 = puVar2[1];
    *puVar7 = uVar3;
    (*Svcs->verbose)(*(void **)((long)WS_Stream_v + 8),5,
                     "Received contact info \"%s\", RD_Stream %p for Reader Rank %d\n",pcVar6,uVar3,
                     uVar8 & 0xffffffff);
    puVar7 = puVar7 + 2;
  }
  pvVar5 = realloc(*(void **)((long)WS_Stream_v + 0x30),
                   (long)*(int *)((long)WS_Stream_v + 0x28) * 0x20 + 0x20);
  *(void **)((long)WS_Stream_v + 0x30) = pvVar5;
  iVar1 = *(int *)((long)WS_Stream_v + 0x28);
  *(undefined8 **)((long)pvVar5 + (long)iVar1 * 8) = puVar4;
  *(int *)((long)WS_Stream_v + 0x28) = iVar1 + 1;
  puVar7 = (undefined8 *)calloc(1,0x10);
  *puVar7 = __s;
  puVar7[1] = puVar4;
  *WriterContactInfoPtr = puVar7;
  return puVar4;
}

Assistant:

static DP_WSR_Stream DummyInitWriterPerReader(CP_Services Svcs, DP_WS_Stream WS_Stream_v,
                                              int readerCohortSize, CP_PeerCohort PeerCohort,
                                              void **providedReaderInfo_v,
                                              void **WriterContactInfoPtr)
{
    Dummy_WS_Stream WS_Stream = (Dummy_WS_Stream)WS_Stream_v;
    Dummy_WSR_Stream WSR_Stream = malloc(sizeof(*WSR_Stream));
    DummyWriterContactInfo ContactInfo;
    SMPI_Comm comm = Svcs->getMPIComm(WS_Stream->CP_Stream);
    int Rank;
    char *DummyContactString = malloc(64);
    DummyReaderContactInfo *providedReaderInfo = (DummyReaderContactInfo *)providedReaderInfo_v;

    SMPI_Comm_rank(comm, &Rank);
    snprintf(DummyContactString, 64, "Writer Rank %d, test contact", Rank);

    WSR_Stream->WS_Stream = WS_Stream; /* pointer to writer struct */
    WSR_Stream->PeerCohort = PeerCohort;

    /*
     * make a copy of writer contact information (original will not be
     * preserved)
     */
    WSR_Stream->ReaderContactInfo =
        malloc(sizeof(struct _DummyReaderContactInfo) * readerCohortSize);
    for (int i = 0; i < readerCohortSize; i++)
    {
        WSR_Stream->ReaderContactInfo[i].ContactString =
            strdup(providedReaderInfo[i]->ContactString);
        WSR_Stream->ReaderContactInfo[i].RS_Stream = providedReaderInfo[i]->RS_Stream;
        Svcs->verbose(WS_Stream->CP_Stream, DPTraceVerbose,
                      "Received contact info \"%s\", RD_Stream %p for Reader Rank %d\n",
                      WSR_Stream->ReaderContactInfo[i].ContactString,
                      WSR_Stream->ReaderContactInfo[i].RS_Stream, i);
    }

    /*
     * add this writer-side reader-specific stream to the parent writer stream
     * structure
     */
    WS_Stream->Readers =
        realloc(WS_Stream->Readers, sizeof(*WSR_Stream) * (WS_Stream->ReaderCount + 1));
    WS_Stream->Readers[WS_Stream->ReaderCount] = WSR_Stream;
    WS_Stream->ReaderCount++;

    ContactInfo = malloc(sizeof(struct _DummyWriterContactInfo));
    memset(ContactInfo, 0, sizeof(struct _DummyWriterContactInfo));
    ContactInfo->ContactString = DummyContactString;
    ContactInfo->WS_Stream = WSR_Stream;
    *WriterContactInfoPtr = ContactInfo;

    return WSR_Stream;
}